

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O0

void __thiscall
ndfx_solver::ndfx_solver
          (ndfx_solver *this,field3d<celle> *ce0,field3d<cellb> *cb0,field3d<cellj> *cj0,double dt,
          double dx,double dy,double dz)

{
  field3d<cellj> *in_RCX;
  field3d<cellb> *in_RDX;
  field3d<celle> *in_RSI;
  maxwell_solver *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  
  maxwell_solver::maxwell_solver
            (in_RDI,in_RSI,in_RDX,in_RCX,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa);
  in_RDI->_vptr_maxwell_solver = (_func_int **)&PTR_advance_b_00192c10;
  in_RDI[1].ce = (field3d<celle> *)
                 (1.0 - (kappa * in_XMM1_Qa * in_XMM1_Qa) / (in_XMM2_Qa * in_XMM2_Qa));
  in_RDI[1].cj = (field3d<cellj> *)
                 (1.0 - (kappa * in_XMM1_Qa * in_XMM1_Qa) / (in_XMM3_Qa * in_XMM3_Qa));
  in_RDI[1]._vptr_maxwell_solver = (_func_int **)((1.0 - (double)in_RDI[1].ce) * 0.5);
  in_RDI[1].cb = (field3d<cellb> *)((1.0 - (double)in_RDI[1].cj) * 0.5);
  return;
}

Assistant:

ndfx_solver::ndfx_solver(field3d<celle> & ce0, field3d<cellb> & cb0, field3d<cellj> & cj0, double dt, double dx,
        double dy, double dz) :
        maxwell_solver(ce0, cb0, cj0, dt, dx, dy, dz),
        by(1 - kappa * dx * dx / (dy * dy)),
        bz(1 - kappa * dx * dx / (dz * dz)) {
    ay = 0.5 * (1 - by);
    az = 0.5 * (1 - bz);
}